

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

bool __thiscall Cache::policyValid(Cache *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *__format;
  
  uVar1 = (this->policy).cache_size;
  if ((uVar1 - 1 & uVar1) == 0) {
    uVar2 = (this->policy).block_size;
    if ((uVar2 - 1 & uVar2) == 0) {
      uVar3 = (this->policy).block_num;
      if (uVar2 * uVar3 == uVar1) {
        if (uVar3 % (this->policy).associativity == 0) {
          return true;
        }
        policyValid();
      }
      else {
        policyValid();
      }
      return false;
    }
    __format = "Block Size Invalid: %d\n";
    uVar1 = uVar2;
  }
  else {
    __format = "Cache Size Invalid: %d\n";
  }
  fprintf(_stderr,__format,(ulong)uVar1);
  return false;
}

Assistant:

bool Cache::policyValid() const {
    if (!(is_pow(policy.cache_size))) {
        fprintf(stderr, "Cache Size Invalid: %d\n", policy.cache_size);
        return false;
    }
    if (!(is_pow(policy.block_size))) {
        fprintf(stderr, "Block Size Invalid: %d\n", policy.block_size);
        return false;
    }
    if (policy.block_num * policy.block_size != policy.cache_size) {
        fprintf(stderr, "block_num * block_size != cache_size\n");
        return false;
    }
    if (policy.block_num % policy.associativity != 0) {
        fprintf(stderr, "block_num %% associativity != 0\n");
        return false;
    }
    return true;
}